

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitTableGrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,TableGrow *curr)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ExpressionRunner<wasm::ModuleRunner> *pEVar4;
  ExternalInterface *pEVar5;
  ulong a;
  long lVar6;
  address64_t aVar7;
  Literal *pLVar8;
  Name NVar9;
  uint local_208;
  undefined4 uStack_204;
  uint64_t newSize;
  uint64_t delta;
  Literal local_1f0;
  undefined1 local_1d8 [8];
  Flow fail;
  Literal local_188;
  undefined1 local_170 [8];
  Flow ret;
  Table *table;
  uint64_t tableSize;
  undefined1 local_d8 [8];
  TableInstanceInfo info;
  Flow deltaFlow;
  undefined1 local_68 [8];
  Flow valueFlow;
  TableGrow *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  valueFlow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar4,
             *(Expression **)(valueFlow.breakTo.super_IString.str._M_str + 0x20));
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar4 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&info.name.super_IString.str._M_str,pEVar4,
               *(Expression **)(valueFlow.breakTo.super_IString.str._M_str + 0x28));
    bVar2 = Flow::breaking((Flow *)&info.name.super_IString.str._M_str);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&info.name.super_IString.str._M_str);
    }
    else {
      getTableInstanceInfo
                ((TableInstanceInfo *)local_d8,this,
                 (Name)((IString *)(valueFlow.breakTo.super_IString.str._M_str + 0x10))->str);
      pEVar5 = TableInstanceInfo::interface((TableInstanceInfo *)local_d8);
      uVar3 = (*pEVar5->_vptr_ExternalInterface[0x1b])
                        (pEVar5,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                         CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                  (undefined4)info.name.super_IString.str._M_len));
      a = (ulong)uVar3;
      NVar9.super_IString.str._M_str._4_4_ = info.instance._4_4_;
      NVar9.super_IString.str._M_str._0_4_ = info.instance._0_4_;
      NVar9.super_IString.str._M_len =
           (size_t)((ModuleRunnerBase<wasm::ModuleRunner> *)local_d8)->wasm;
      lVar6 = ::wasm::Module::getTable(NVar9);
      fail.breakTo.super_IString.str._M_str = *(char **)(lVar6 + 0x48);
      wasm::Literal::makeFromInt64(&local_188,a,(Type)fail.breakTo.super_IString.str._M_str);
      Flow::Flow((Flow *)local_170,&local_188);
      ::wasm::Literal::~Literal(&local_188);
      delta = *(uintptr_t *)(lVar6 + 0x48);
      wasm::Literal::makeFromInt64(&local_1f0,-1,(Type)delta);
      Flow::Flow((Flow *)local_1d8,&local_1f0);
      ::wasm::Literal::~Literal(&local_1f0);
      Flow::getSingleValue((Flow *)&info.name.super_IString.str._M_str);
      newSize = ::wasm::Literal::getUnsigned();
      bVar2 = std::ckd_add<unsigned_long>((unsigned_long *)&local_208,a,newSize);
      if (bVar2) {
        Flow::Flow(__return_storage_ptr__,(Flow *)local_1d8);
      }
      else {
        uVar1 = CONCAT44(uStack_204,local_208);
        aVar7 = Address::operator_cast_to_unsigned_long((Address *)(lVar6 + 0x40));
        if ((aVar7 < uVar1) || (10000000 < CONCAT44(uStack_204,local_208))) {
          Flow::Flow(__return_storage_ptr__,(Flow *)local_1d8);
        }
        else {
          pEVar5 = TableInstanceInfo::interface((TableInstanceInfo *)local_d8);
          pLVar8 = Flow::getSingleValue((Flow *)local_68);
          uVar3 = (*pEVar5->_vptr_ExternalInterface[7])
                            (pEVar5,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                             CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                      (undefined4)info.name.super_IString.str._M_len),pLVar8,a,
                             (ulong)local_208);
          if ((uVar3 & 1) == 0) {
            Flow::Flow(__return_storage_ptr__,(Flow *)local_1d8);
          }
          else {
            Flow::Flow(__return_storage_ptr__,(Flow *)local_170);
          }
        }
      }
      Flow::~Flow((Flow *)local_1d8);
      Flow::~Flow((Flow *)local_170);
    }
    Flow::~Flow((Flow *)&info.name.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitTableGrow(TableGrow* curr) {
    NOTE_ENTER("TableGrow");
    Flow valueFlow = self()->visit(curr->value);
    if (valueFlow.breaking()) {
      return valueFlow;
    }
    Flow deltaFlow = self()->visit(curr->delta);
    if (deltaFlow.breaking()) {
      return deltaFlow;
    }
    auto info = getTableInstanceInfo(curr->table);

    uint64_t tableSize = info.interface()->tableSize(info.name);
    auto* table = info.instance->wasm.getTable(info.name);
    Flow ret = Literal::makeFromInt64(tableSize, table->addressType);
    Flow fail = Literal::makeFromInt64(-1, table->addressType);
    uint64_t delta = deltaFlow.getSingleValue().getUnsigned();

    uint64_t newSize;
    if (std::ckd_add(&newSize, tableSize, delta)) {
      return fail;
    }
    if (newSize > table->max || newSize > WebLimitations::MaxTableSize) {
      return fail;
    }
    if (!info.interface()->growTable(
          info.name, valueFlow.getSingleValue(), tableSize, newSize)) {
      // We failed to grow the table in practice, even though it was valid
      // to try to do so.
      return fail;
    }
    return ret;
  }